

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O0

CKeyID * GetKeyForDestination(SigningProvider *store,CTxDestination *dest)

{
  byte bVar1;
  bool bVar2;
  add_pointer_t<const_PKHash> ptVar3;
  add_pointer_t<const_WitnessV0KeyHash> this;
  XOnlyPubKey *pubkey;
  add_pointer_t<WitnessV0KeyHash> ptVar4;
  add_pointer_t<const_WitnessV1Taproot> ptVar5;
  long *in_RSI;
  base_blob<256U> *in_RDI;
  long in_FS_OFFSET;
  add_pointer_t<const_WitnessV1Taproot> output_key;
  add_pointer_t<WitnessV0KeyHash> inner_witness_id;
  add_pointer_t<const_ScriptHash> script_hash;
  add_pointer_t<const_WitnessV0KeyHash> witness_id;
  add_pointer_t<const_PKHash> id;
  CPubKey pub;
  TaprootSpendData spenddata;
  CTxDestination inner_dest;
  CScriptID script_id;
  CScript script;
  TaprootSpendData *in_stack_fffffffffffffe48;
  base_blob<256U> *script_hash_00;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  int iVar6;
  CPubKey *in_stack_fffffffffffffe88;
  undefined1 local_100 [48];
  CTxDestination *in_stack_ffffffffffffff30;
  CScript *in_stack_ffffffffffffff38;
  undefined1 local_3c [20];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  script_hash_00 = in_RDI;
  ptVar3 = std::
           get_if<PKHash,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                     ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)in_stack_fffffffffffffe48);
  if (ptVar3 == (add_pointer_t<const_PKHash>)0x0) {
    this = std::
           get_if<WitnessV0KeyHash,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                     ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)in_stack_fffffffffffffe48);
    if (this == (add_pointer_t<const_WitnessV0KeyHash>)0x0) {
      pubkey = (XOnlyPubKey *)
               std::
               get_if<ScriptHash,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                         ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)in_stack_fffffffffffffe48);
      if (pubkey != (XOnlyPubKey *)0x0) {
        CScript::CScript((CScript *)in_stack_fffffffffffffe48);
        ToScriptID((ScriptHash *)script_hash_00);
        std::
        variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   *)in_stack_fffffffffffffe48);
        bVar1 = (**(code **)(*in_RSI + 0x10))(in_RSI,local_3c,local_28);
        if ((((bVar1 & 1) == 0) ||
            (bVar2 = ExtractDestination(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30), !bVar2
            )) || (ptVar4 = std::
                            get_if<WitnessV0KeyHash,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                                      ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                        *)in_stack_fffffffffffffe48),
                  ptVar4 == (add_pointer_t<WitnessV0KeyHash>)0x0)) {
          iVar6 = 0;
        }
        else {
          ToKeyID((WitnessV0KeyHash *)script_hash_00);
          iVar6 = 1;
        }
        std::
        variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    *)in_stack_fffffffffffffe48);
        CScript::~CScript((CScript *)in_stack_fffffffffffffe48);
        if (iVar6 != 0) goto LAB_007e5ec6;
        in_stack_fffffffffffffe74 = 0;
      }
      ptVar5 = std::
               get_if<WitnessV1Taproot,CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
                         ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                           *)in_stack_fffffffffffffe48);
      if (ptVar5 != (add_pointer_t<const_WitnessV1Taproot>)0x0) {
        TaprootSpendData::TaprootSpendData(in_stack_fffffffffffffe48);
        CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffe48);
        bVar1 = (**(code **)(*in_RSI + 0x40))(in_RSI,ptVar5,local_100);
        if ((((bVar1 & 1) == 0) ||
            (bVar2 = XOnlyPubKey::IsNull(&in_stack_fffffffffffffe48->internal_key), bVar2)) ||
           ((bVar2 = base_blob<256U>::IsNull(in_RDI), !bVar2 ||
            (bVar2 = SigningProvider::GetPubKeyByXOnly
                               ((SigningProvider *)this,pubkey,in_stack_fffffffffffffe88), !bVar2)))
           ) {
          iVar6 = 0;
        }
        else {
          CPubKey::GetID((CPubKey *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
          iVar6 = 1;
        }
        TaprootSpendData::~TaprootSpendData(in_stack_fffffffffffffe48);
        if (iVar6 != 0) goto LAB_007e5ec6;
      }
      CKeyID::CKeyID((CKeyID *)in_stack_fffffffffffffe48);
    }
    else {
      ToKeyID((WitnessV0KeyHash *)script_hash_00);
    }
  }
  else {
    ToKeyID((PKHash *)script_hash_00);
  }
LAB_007e5ec6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (CKeyID *)script_hash_00;
}

Assistant:

CKeyID GetKeyForDestination(const SigningProvider& store, const CTxDestination& dest)
{
    // Only supports destinations which map to single public keys:
    // P2PKH, P2WPKH, P2SH-P2WPKH, P2TR
    if (auto id = std::get_if<PKHash>(&dest)) {
        return ToKeyID(*id);
    }
    if (auto witness_id = std::get_if<WitnessV0KeyHash>(&dest)) {
        return ToKeyID(*witness_id);
    }
    if (auto script_hash = std::get_if<ScriptHash>(&dest)) {
        CScript script;
        CScriptID script_id = ToScriptID(*script_hash);
        CTxDestination inner_dest;
        if (store.GetCScript(script_id, script) && ExtractDestination(script, inner_dest)) {
            if (auto inner_witness_id = std::get_if<WitnessV0KeyHash>(&inner_dest)) {
                return ToKeyID(*inner_witness_id);
            }
        }
    }
    if (auto output_key = std::get_if<WitnessV1Taproot>(&dest)) {
        TaprootSpendData spenddata;
        CPubKey pub;
        if (store.GetTaprootSpendData(*output_key, spenddata)
            && !spenddata.internal_key.IsNull()
            && spenddata.merkle_root.IsNull()
            && store.GetPubKeyByXOnly(spenddata.internal_key, pub)) {
            return pub.GetID();
        }
    }
    return CKeyID();
}